

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

lys_node * ly_ctx_get_node(ly_ctx *ctx,lys_node *start,char *nodeid)

{
  LY_ERR *pLVar1;
  lys_node *plVar2;
  
  if ((nodeid != (char *)0x0 && ctx != (ly_ctx *)0x0) &&
     ((start != (lys_node *)0x0 || (*nodeid == '/')))) {
    plVar2 = resolve_json_nodeid(nodeid,ctx,start);
    return plVar2;
  }
  pLVar1 = ly_errno_location();
  *pLVar1 = LY_EINVAL;
  return (lys_node *)0x0;
}

Assistant:

lys_node *
ly_ctx_get_node(struct ly_ctx *ctx, const struct lys_node *start, const char *nodeid)
{
    const struct lys_node *node;

    if (!ctx || !nodeid || ((nodeid[0] != '/') && !start)) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    /* sets error and everything */
    node = resolve_json_nodeid(nodeid, ctx, start);

    return node;
}